

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_op_setupvali(lua_State *L,LClosure *cl,TValue *ra,int b)

{
  UpVal *pUVar1;
  Value *pVVar2;
  int iVar3;
  TValue *p;
  lua_Integer ia;
  
  p = ra;
  if (ra->tt_ != 0x13) {
    p = (TValue *)&stack0xffffffffffffffd0;
    iVar3 = luaV_tointegerns(ra,(lua_Integer *)p,F2Ieq);
    if (iVar3 == 0) {
      luaG_runerror(L,"upvalue of integer type, cannot be set to non integer value");
    }
  }
  pUVar1 = cl->upvals[b];
  pVVar2 = &pUVar1->v->value_;
  *pVVar2 = p->value_;
  *(undefined2 *)(pVVar2 + 1) = 0x13;
  if (((short)ra->tt_ < 0) && (pUVar1->v == (TValue *)&pUVar1->u)) {
    luaC_upvalbarrier_(L,(ra->value_).gc);
    return;
  }
  return;
}

Assistant:

void raviV_op_setupvali(lua_State *L, LClosure *cl, TValue *ra, int b) {
  lua_Integer ia;
  if (tointegerns(ra, &ia)) {
    UpVal *uv = cl->upvals[b];
    setivalue(uv->v, ia);
    luaC_upvalbarrier(L, uv, ra);
  }
  else
    luaG_runerror(
        L, "upvalue of integer type, cannot be set to non integer value");
}